

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O3

exr_result_t save_m33f(exr_context_t ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  int32_t isz;
  exr_attr_m33f_t tmp;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  exr_attribute_type_t eStack_24;
  float fStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  
  local_18 = *(undefined4 *)&a[1].name;
  local_38 = *(undefined4 *)&a->name;
  uStack_34 = *(undefined4 *)((long)&a->name + 4);
  uStack_30 = *(undefined4 *)&a->type_name;
  uStack_2c = *(undefined4 *)((long)&a->type_name + 4);
  local_28._0_1_ = a->name_length;
  local_28._1_1_ = a->type_name_length;
  local_28._2_1_ = a->pad[0];
  local_28._3_1_ = a->pad[1];
  eStack_24 = a->type;
  fStack_20 = (a->field_6).f;
  uStack_1c = *(undefined4 *)((long)&a->field_6 + 4);
  local_3c = 0x24;
  eVar1 = (*ctxt->do_write)(ctxt,&local_3c,4,&ctxt->output_file_offset);
  if (eVar1 == 0) {
    eVar1 = (*ctxt->do_write)(ctxt,&local_38,0x24,&ctxt->output_file_offset);
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_m33f (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t    rv;
    exr_attr_m33f_t tmp = *(a->m33f);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_m33f_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 9);
    return rv;
}